

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

void __thiscall kj::_::Debug::Context::~Context(Context *this)

{
  (this->super_ExceptionCallback)._vptr_ExceptionCallback = (_func_int **)&PTR__Context_0021e330;
  NullableValue<kj::_::Debug::Context::Value>::~NullableValue(&(this->value).ptr);
  ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

Debug::Context::~Context() noexcept(false) {}